

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O0

err_t cmdSigSelfVerify2(octet *anchor,size_t anchor_len)

{
  size_t *count_00;
  char *buf;
  size_t count;
  err_t code;
  size_t in_stack_00000030;
  octet *in_stack_00000038;
  char *in_stack_00000040;
  char *in_stack_00000048;
  size_t in_stack_ffffffffffffffc8;
  size_t *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = cmdSysModulePath(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (local_4 == 0) {
    count_00 = (size_t *)blobCreate(in_stack_ffffffffffffffc8);
    local_4 = 0x6e;
    if (count_00 != (size_t *)0x0) {
      local_4 = 0;
    }
    if (local_4 == 0) {
      local_4 = cmdSysModulePath(in_stack_ffffffffffffffd8,count_00);
      if (local_4 == 0) {
        local_4 = cmdSigVerify2(in_stack_00000048,in_stack_00000040,in_stack_00000038,
                                in_stack_00000030);
        blobClose((blob_t)0x10a7be);
      }
      else {
        blobClose((blob_t)0x10a78d);
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdSigSelfVerify2(const octet anchor[], size_t anchor_len)
{
	err_t code;
	size_t count;
	char* buf;
	// определить имя исполняемого модуля
	code = cmdSysModulePath(0, &count);
	ERR_CALL_CHECK(code);
	code = cmdBlobCreate(buf, count);
	ERR_CALL_CHECK(code);
	code = cmdSysModulePath(buf, &count);
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// проверить подпись
	code = cmdSigVerify2(buf, buf, anchor, anchor_len);
	// завершить
	cmdBlobClose(buf);
	return code;
}